

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshareddata.h
# Opt level: O0

void __thiscall
QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach_helper
          (QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  DeclarationData *this_00;
  int in_ECX;
  void *in_RDX;
  __fn *in_RSI;
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *in_RDI;
  void *in_R8;
  DeclarationData *x;
  
  iVar2 = clone(in_RDI,in_RSI,in_RDX,in_ECX,in_R8);
  QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x48a33b);
  Qt::totally_ordered_wrapper<QCss::Declaration::DeclarationData_*>::operator->
            ((totally_ordered_wrapper<QCss::Declaration::DeclarationData_*> *)0x48a345);
  bVar1 = QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x48a34d);
  if ((!bVar1) &&
     (this_00 = Qt::totally_ordered_wrapper<QCss::Declaration::DeclarationData_*>::get(&in_RDI->d),
     this_00 != (DeclarationData *)0x0)) {
    QCss::Declaration::DeclarationData::~DeclarationData(this_00);
    operator_delete(this_00,0x68);
  }
  Qt::totally_ordered_wrapper<QCss::Declaration::DeclarationData_*>::reset
            (&in_RDI->d,(DeclarationData *)CONCAT44(extraout_var,iVar2));
  return;
}

Assistant:

Q_OUTOFLINE_TEMPLATE void QExplicitlySharedDataPointer<T>::detach_helper()
{
    T *x = clone();
    x->ref.ref();
    if (!d->ref.deref())
        delete d.get();
    d.reset(x);
}